

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

QString * QtMWidgets::maxShortMonth(QString *__return_storage_ptr__,QStyleOption *opt)

{
  int iVar1;
  QStyleOption *pQVar2;
  QRect QVar3;
  QLocale local_88 [9];
  QLatin1Char local_7f;
  QChar local_7e [7];
  QLocale local_70 [8];
  QString local_68;
  QString local_50;
  QRect local_38;
  int local_28;
  int local_24;
  int tmpWidth;
  int i;
  int width;
  int index;
  QStyleOption *opt_local;
  
  i = 1;
  tmpWidth = 0;
  _width = opt;
  opt_local = (QStyleOption *)__return_storage_ptr__;
  for (local_24 = 1; local_24 < 0xd; local_24 = local_24 + 1) {
    pQVar2 = _width + 0x20;
    QLocale::system();
    QLocale::monthName((int)&local_68,(FormatType)local_70);
    QLatin1Char::QLatin1Char(&local_7f,' ');
    QChar::QChar(local_7e,local_7f);
    operator+(&local_50,&local_68,local_7e[0]);
    QVar3 = (QRect)QFontMetrics::boundingRect((QString *)pQVar2);
    local_38 = QVar3;
    iVar1 = QRect::width(&local_38);
    QString::~QString(&local_50);
    QString::~QString(&local_68);
    QLocale::~QLocale(local_70);
    if (tmpWidth < iVar1) {
      i = local_24;
      tmpWidth = iVar1;
    }
    local_28 = iVar1;
  }
  QLocale::system();
  QLocale::monthName((int)__return_storage_ptr__,(FormatType)local_88);
  QLocale::~QLocale(local_88);
  return __return_storage_ptr__;
}

Assistant:

static inline QString
maxShortMonth( const QStyleOption & opt )
{
	int index = 1;
	int width = 0;

	for( int i = 1; i < 13; ++i )
	{
		const int tmpWidth = opt.fontMetrics.boundingRect(
			QLocale::system().monthName( i, QLocale::ShortFormat ) + QLatin1Char( ' ' ) ).width();

		if( tmpWidth > width  )
		{
			index = i;
			width = tmpWidth;
		}
	}

	return QLocale::system().monthName( index, QLocale::ShortFormat );
}